

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

void b2CollidePolygons(btManifoldResult *manifold,btBox2dShape *polyA,btTransform *xfA,
                      btBox2dShape *polyB,btTransform *xfB)

{
  bool bVar1;
  int iVar2;
  btMatrix3x3 *pbVar3;
  btScalar *pbVar4;
  btBox2dShape *in_RCX;
  btBox2dShape *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar5;
  btVector3 bVar6;
  btScalar separation;
  int i;
  int pointCount;
  btVector3 manifoldNormal;
  int np;
  ClipVertex clipPoints2 [2];
  ClipVertex clipPoints1 [2];
  btScalar sideOffset2;
  btScalar sideOffset1;
  btScalar frontOffset;
  btVector3 frontNormal;
  btVector3 sideNormal;
  btVector3 v12;
  btVector3 v11;
  btVector3 *vertices1;
  int count1;
  ClipVertex incidentEdge [2];
  btScalar k_absoluteTol;
  btScalar k_relativeTol;
  uchar flip;
  int edge1;
  btTransform xf2;
  btTransform xf1;
  btBox2dShape *poly2;
  btBox2dShape *poly1;
  btScalar separationB;
  int edgeB;
  btScalar separationA;
  int edgeA;
  btTransform *in_stack_fffffffffffffd08;
  btTransform *in_stack_fffffffffffffd10;
  btVector3 *pbVar7;
  btVector3 *in_stack_fffffffffffffd18;
  btMatrix3x3 *in_stack_fffffffffffffd20;
  btScalar *local_2c8;
  ClipVertex *vIn;
  btTransform *this;
  btScalar *local_288;
  btVector3 *local_280;
  undefined1 *local_268;
  undefined8 local_260;
  undefined8 local_258;
  float local_250;
  int local_24c;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  btScalar in_stack_fffffffffffffde0;
  btScalar in_stack_fffffffffffffde4;
  btScalar in_stack_fffffffffffffde8;
  btScalar in_stack_fffffffffffffdec;
  btScalar in_stack_fffffffffffffdf0;
  btScalar in_stack_fffffffffffffdf4;
  int *in_stack_fffffffffffffdf8;
  btVector3 local_1f4;
  btScalar local_1e0;
  btScalar local_1dc;
  btScalar local_1d8;
  btScalar local_1d4;
  btScalar local_1d0;
  btScalar local_1cc;
  btVector3 local_1c8;
  btVector3 bStack_1b4;
  btScalar local_1a0;
  btScalar local_19c;
  btScalar local_198;
  btScalar local_194 [2];
  btScalar local_18c [2];
  btScalar local_184 [2];
  btScalar abStack_17c [2];
  btScalar local_174;
  btScalar local_170;
  btScalar local_16c;
  btVector3 local_168;
  undefined8 local_158;
  undefined8 local_150;
  btVector3 local_148;
  btVector3 local_138;
  undefined1 local_128 [28];
  int local_10c;
  undefined1 local_108 [40];
  undefined1 auStack_e0 [8];
  undefined4 local_d8;
  undefined4 local_d4;
  bool local_cd;
  int local_cc;
  btTransform local_88;
  btBox2dShape *local_48;
  btBox2dShape *local_40;
  btScalar local_38;
  int local_34;
  btScalar local_30;
  int local_2c;
  btBox2dShape *local_20;
  btBox2dShape *local_10;
  btVector3 *local_8;
  
  local_2c = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = FindMaxSeparation(in_stack_fffffffffffffdf8,
                               (btBox2dShape *)
                               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                               (btTransform *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                               (btBox2dShape *)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                               (btTransform *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if (local_30 <= 0.0) {
    local_34 = 0;
    local_38 = FindMaxSeparation(in_stack_fffffffffffffdf8,
                                 (btBox2dShape *)
                                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                 (btTransform *)
                                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                 (btBox2dShape *)
                                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                                 (btTransform *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (local_38 <= 0.0) {
      btTransform::btTransform(in_stack_fffffffffffffd10);
      btTransform::btTransform(in_stack_fffffffffffffd10);
      local_d4 = 0x3f7ae148;
      local_d8 = 0x3a83126f;
      bVar1 = local_38 <= local_30 * 0.98 + 0.001;
      if (bVar1) {
        local_40 = local_10;
        local_48 = local_20;
        btTransform::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        btTransform::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        local_cc = local_2c;
      }
      else {
        local_40 = local_20;
        local_48 = local_10;
        btTransform::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        btTransform::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        local_cc = local_34;
      }
      local_cd = !bVar1;
      local_268 = local_108;
      do {
        ClipVertex::ClipVertex((ClipVertex *)0x17171e);
        local_268 = local_268 + 0x14;
      } while (local_268 != auStack_e0);
      FindIncidentEdge((ClipVertex *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       (btBox2dShape *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                       ,(btTransform *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                       ,in_stack_fffffffffffffdcc,
                       (btBox2dShape *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                       ,(btTransform *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                      );
      local_10c = btBox2dShape::getVertexCount(local_40);
      local_128._16_8_ = btBox2dShape::getVertices(local_40);
      local_128._0_8_ =
           *(undefined8 *)((btVector3 *)(local_128._16_8_ + (long)local_cc * 0x10))->m_floats;
      local_128._8_8_ =
           *(undefined8 *)(((btVector3 *)(local_128._16_8_ + (long)local_cc * 0x10))->m_floats + 2);
      local_280 = (btVector3 *)local_128._16_8_;
      if (local_cc + 1 < local_10c) {
        local_280 = (btVector3 *)(local_128._16_8_ + (long)(local_cc + 1) * 0x10);
      }
      local_138.m_floats._0_8_ = *(undefined8 *)local_280->m_floats;
      local_138.m_floats._8_8_ = *(undefined8 *)(local_280->m_floats + 2);
      this = &local_88;
      pbVar3 = btTransform::getBasis(this);
      vIn = (ClipVertex *)local_128;
      bVar6 = operator-(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
      local_158 = bVar6.m_floats._0_8_;
      local_150 = bVar6.m_floats._8_8_;
      bVar6 = operator*(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      local_148.m_floats._0_8_ = bVar6.m_floats._0_8_;
      local_148.m_floats._8_8_ = bVar6.m_floats._8_8_;
      pbVar7 = &local_148;
      btVector3::normalize((btVector3 *)in_stack_fffffffffffffd10);
      pbVar4 = btVector3::getY(pbVar7);
      local_16c = *pbVar4;
      pbVar4 = btVector3::getX(pbVar7);
      local_170 = -*pbVar4;
      local_174 = 0.0;
      btVector3::btVector3(&local_168,&local_16c,&local_170,&local_174);
      bVar6 = btTransform::operator*
                        (in_stack_fffffffffffffd10,(btVector3 *)in_stack_fffffffffffffd08);
      local_184 = bVar6.m_floats._0_8_;
      abStack_17c = bVar6.m_floats._8_8_;
      local_128._0_8_ = local_184;
      local_128._8_8_ = abStack_17c;
      bVar6 = btTransform::operator*
                        (in_stack_fffffffffffffd10,(btVector3 *)in_stack_fffffffffffffd08);
      local_194 = bVar6.m_floats._0_8_;
      local_18c = bVar6.m_floats._8_8_;
      local_138.m_floats._0_8_ = local_194;
      local_138.m_floats._8_8_ = local_18c;
      local_198 = btVector3::dot(&local_168,(btVector3 *)local_128);
      local_19c = btVector3::dot(&local_148,(btVector3 *)local_128);
      local_19c = -local_19c;
      local_1a0 = btVector3::dot(&local_148,&local_138);
      local_288 = local_1c8.m_floats;
      do {
        ClipVertex::ClipVertex((ClipVertex *)0x171a05);
        local_288 = local_288 + 5;
      } while (local_288 != &local_1a0);
      local_1cc = 0.0;
      local_1d0 = 0.0;
      local_1d4 = 0.0;
      btVector3::setValue(&local_1c8,&local_1cc,&local_1d0,&local_1d4);
      local_1d8 = 0.0;
      local_1dc = 0.0;
      local_1e0 = 0.0;
      btVector3::setValue(&bStack_1b4,&local_1d8,&local_1dc,&local_1e0);
      local_2c8 = (btScalar *)&stack0xfffffffffffffdf8;
      do {
        ClipVertex::ClipVertex((ClipVertex *)0x171adb);
        bVar5 = (btScalar)((ulong)pbVar3 >> 0x20);
        local_2c8 = local_2c8 + 5;
      } while (local_2c8 != &local_1e0);
      btVector3::setValue((btVector3 *)&stack0xfffffffffffffdf8,(btScalar *)&stack0xfffffffffffffdf4
                          ,(btScalar *)&stack0xfffffffffffffdf0,(btScalar *)&stack0xfffffffffffffdec
                         );
      btVector3::setValue(&local_1f4,(btScalar *)&stack0xfffffffffffffde8,
                          (btScalar *)&stack0xfffffffffffffde4,(btScalar *)&stack0xfffffffffffffde0)
      ;
      operator-((btVector3 *)in_stack_fffffffffffffd10);
      iVar2 = ClipSegmentToLine((ClipVertex *)this,vIn,pbVar7,bVar5);
      if ((1 < iVar2) && (iVar2 = ClipSegmentToLine((ClipVertex *)this,vIn,pbVar7,bVar5), 1 < iVar2)
         ) {
        if (local_cd != false) {
          operator-((btVector3 *)in_stack_fffffffffffffd10);
        }
        for (local_24c = 0; local_24c < b2_maxManifoldPoints; local_24c = local_24c + 1) {
          bVar5 = btVector3::dot(&local_168,
                                 (btVector3 *)((long)&local_1f4 + (long)local_24c * 0x14 + -0x14));
          local_250 = bVar5 - local_198;
          if (local_250 <= 0.0) {
            pbVar7 = local_8;
            bVar6 = operator-(local_8);
            local_260 = bVar6.m_floats._0_8_;
            local_258 = bVar6.m_floats._8_8_;
            (**(code **)(*(long *)pbVar7->m_floats + 0x20))
                      (pbVar7,&local_260,(long)&local_1f4 + (long)local_24c * 0x14 + -0x14);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(btManifoldResult* manifold,
					  const btBox2dShape* polyA, const btTransform& xfA,
					  const btBox2dShape* polyB, const btTransform& xfB)
{

	int edgeA = 0;
	btScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	btScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const btBox2dShape* poly1;	// reference poly
	const btBox2dShape* poly2;	// incident poly
	btTransform xf1, xf2;
	int edge1;		// reference edge
	unsigned char flip;
	const btScalar k_relativeTol = 0.98f;
	const btScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const btVector3* vertices1 = poly1->getVertices();

	btVector3 v11 = vertices1[edge1];
	btVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1+1] : vertices1[0];

	//btVector3 dv = v12 - v11;
	btVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	btVector3 frontNormal = btCrossS(sideNormal, 1.0f);
	
	
	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	btScalar frontOffset = b2Dot(frontNormal, v11);
	btScalar sideOffset1 = -b2Dot(sideNormal, v11);
	btScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0,0,0);
	clipPoints1[1].v.setValue(0,0,0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0,0,0);
	clipPoints2[1].v.setValue(0,0,0);


	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1,  sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	btVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		btScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//btScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal,clipPoints2[i].v,separation);

//			cp->id = clipPoints2[i].id;
//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

//	manifold->pointCount = pointCount;}
}